

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O1

int excline(char *line,int llen,int lnum)

{
  byte bVar1;
  ushort uVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  maps_s *pmVar6;
  line *plVar7;
  ulong uVar8;
  line *plVar9;
  bool bVar10;
  key *pkVar11;
  long lVar12;
  byte *pbVar13;
  byte *pbVar14;
  byte *pbVar15;
  char *pcVar16;
  char *local_60;
  char *tmp;
  long local_50;
  line *local_48;
  PF local_40;
  KEYMAP *local_38;
  KEYMAP *curmap;
  
  local_38 = (KEYMAP *)0x0;
  if (inmacro != 0 || macrodef != 0) {
    iVar4 = dobeep_msg("Not now!");
    return iVar4;
  }
  do {
    bVar1 = *line;
    if (bVar1 < 0x20) {
      if (bVar1 != 9) goto LAB_0010e428;
    }
    else if (bVar1 != 0x20) goto LAB_0010e41b;
    line = (char *)((byte *)line + 1);
  } while( true );
LAB_0010e6be:
  if ((bVar1 == 0x23) || (bVar1 == 0x3b)) {
    *pbVar13 = 0;
  }
LAB_0010e6cb:
  bVar1 = *pbVar13;
  pbVar15 = pbVar13;
  if (bVar1 == 0x22) {
    do {
      pbVar15 = pbVar15 + (ulong)(*pbVar15 == 0x5c) + 1;
      if (*pbVar15 == 0) break;
    } while (*pbVar15 != 0x22);
  }
  else {
    if (bVar1 == 0) goto LAB_0010e99d;
    while ((0x29 < (ulong)*pbVar15 || ((0x30100000201U >> ((ulong)*pbVar15 & 0x3f) & 1) == 0))) {
      pbVar15 = pbVar15 + 1;
    }
  }
  if (bVar1 == 0x22) {
    pkVar11 = &key;
    if (iVar4 != 0) {
      plVar9 = lalloc((int)pbVar15 - (int)uVar8);
      if (plVar9 == (line *)0x0) goto LAB_0010ea6d;
      pkVar11 = (key *)&plVar9->l_used;
    }
    pbVar13 = pbVar13 + 1;
    pkVar11->k_count = 0;
    do {
      bVar1 = *pbVar13;
      if (bVar1 == 0x5c) {
        pbVar14 = pbVar13 + 1;
        bVar1 = pbVar13[1];
        if (bVar1 < 0x4e) {
          if (bVar1 - 0x30 < 8) {
            uVar2 = (short)(char)bVar1 - 0x30;
            if ((pbVar13[2] & 0xf8) == 0x30) {
              uVar2 = (ushort)(byte)(pbVar13[2] - 0x30) + uVar2 * 8;
              if ((pbVar13[3] & 0xf8) == 0x30) {
                pbVar14 = pbVar13 + 3;
                uVar2 = (ushort)(byte)(pbVar13[3] - 0x30) + uVar2 * 8;
              }
              else {
                pbVar14 = pbVar13 + 2;
              }
            }
          }
          else if (bVar1 == 0x45) {
LAB_0010e907:
            uVar2 = 0x1b;
          }
          else {
            if (bVar1 != 0x46) goto LAB_0010e894;
LAB_0010e8d4:
            if ((cinfo[pbVar13[3]] & 0x20U) == 0) {
              pbVar14 = pbVar13 + 2;
              sVar3 = (char)pbVar13[2] + -0x30;
            }
            else {
              pbVar14 = pbVar13 + 3;
              sVar3 = (short)(char)pbVar13[3] + (char)pbVar13[2] * 10 + -0x210;
            }
            uVar2 = sVar3 + 0x100;
          }
        }
        else {
          uVar2 = 9;
          if (bVar1 < 0x65) {
            if (bVar1 < 0x54) {
              if (bVar1 != 0x4e) {
                if (bVar1 == 0x52) goto LAB_0010e880;
                goto LAB_0010e894;
              }
LAB_0010e8fd:
              uVar2 = 10;
            }
            else if (bVar1 != 0x54) {
              if (bVar1 != 0x5e) goto LAB_0010e894;
              bVar1 = pbVar13[2];
              uVar2 = (ushort)bVar1;
              if ((cinfo[bVar1] & 4U) != 0) {
                uVar2 = bVar1 - 0x20;
              }
              pbVar14 = pbVar13 + 2;
              uVar2 = uVar2 ^ 0x40;
            }
          }
          else if (bVar1 < 0x6e) {
            if (bVar1 == 0x65) goto LAB_0010e907;
            if (bVar1 == 0x66) goto LAB_0010e8d4;
LAB_0010e894:
            uVar2 = (ushort)bVar1;
          }
          else if (bVar1 != 0x74) {
            if (bVar1 != 0x72) {
              if (bVar1 == 0x6e) goto LAB_0010e8fd;
              goto LAB_0010e894;
            }
LAB_0010e880:
            uVar2 = 0xd;
          }
        }
      }
      else {
        if ((bVar1 == 0) || (bVar1 == 0x22)) goto LAB_0010e92e;
        uVar2 = (ushort)(char)bVar1;
        pbVar14 = pbVar13;
      }
      pbVar13 = pbVar14 + 1;
      if (iVar4 == 0) {
        lVar12 = (long)key.k_count;
        key.k_count = key.k_count + 1;
        key.k_chars[lVar12] = uVar2;
      }
      else {
        iVar5 = plVar9->l_used;
        plVar9->l_used = iVar5 + 1;
        plVar9->l_text[iVar5] = (char)uVar2;
      }
    } while( true );
  }
  if (bVar1 == 0x27) {
    pbVar13 = pbVar13 + 1;
  }
  iVar5 = (int)pbVar15 - (int)pbVar13;
  plVar9 = lalloc(iVar5 + 1);
  if (plVar9 == (line *)0x0) goto LAB_0010ea6d;
  memmove(plVar9->l_text,pbVar13,(long)iVar5);
  plVar9->l_used = plVar9->l_used + -1;
  iVar4 = iVar4 + (uint)(iVar4 == 0);
LAB_0010e936:
  if (iVar4 == 0) {
    iVar4 = 3;
  }
  else if (iVar4 == 2) {
    plVar9->l_text[plVar9->l_used] = '\0';
    local_38 = name_map(plVar9->l_text);
    if (local_38 == (KEYMAP *)0x0) {
      dobeep_msgs("No such mode:",plVar9->l_text);
      free(plVar9);
LAB_0010ea6d:
      iVar5 = 0;
      goto LAB_0010ea7e;
    }
    free(plVar9);
    iVar4 = 0;
  }
  else {
    plVar9->l_fp = local_48->l_fp;
    plVar9->l_bp = local_48;
    local_48->l_fp = plVar9;
    local_48 = plVar9;
  }
  pbVar13 = pbVar15;
  if (*pbVar15 == 0) goto LAB_0010e99d;
  goto LAB_0010e69d;
LAB_0010e92e:
  pbVar15 = pbVar15 + (*pbVar15 != 0);
  goto LAB_0010e936;
LAB_0010e41b:
  if ((bVar1 == 0x23) || (bVar1 == 0x3b)) {
    *line = 0;
  }
LAB_0010e428:
  bVar1 = *line;
  if (bVar1 == 0) {
    return 1;
  }
  if (bVar1 == 0x28) {
    iVar4 = foundparen(line,llen,lnum);
    return iVar4;
  }
  pbVar15 = (byte *)line;
  if (bVar1 == 0x22) {
    do {
      pbVar15 = pbVar15 + (ulong)(*pbVar15 == 0x5c) + 1;
      if (*pbVar15 == 0) break;
    } while (*pbVar15 != 0x22);
  }
  else {
    while ((0x29 < (ulong)*pbVar15 || ((0x30100000201U >> ((ulong)*pbVar15 & 0x3f) & 1) == 0))) {
      pbVar15 = pbVar15 + 1;
    }
  }
  pcVar16 = (char *)0x0;
  pbVar13 = pbVar15;
  if (*pbVar15 == 0) {
LAB_0010e4c0:
    pbVar15 = (byte *)0x0;
  }
  else {
    *pbVar15 = 0;
    do {
      while( true ) {
        pbVar15 = pbVar15 + 1;
        bVar1 = *pbVar15;
        if (bVar1 < 0x20) break;
        if (bVar1 != 0x20) {
          if ((bVar1 == 0x23) || (bVar1 == 0x3b)) {
            *pbVar15 = 0;
          }
          goto LAB_0010e49d;
        }
      }
    } while (bVar1 == 9);
LAB_0010e49d:
    bVar1 = *pbVar15;
    pbVar13 = pbVar15;
    if (((ulong)bVar1 != 0x2d) && ((cinfo[bVar1] & 0x20U) == 0)) goto LAB_0010e4c0;
    if (bVar1 == 0x22) {
      do {
        pbVar13 = pbVar13 + (ulong)(*pbVar13 == 0x5c) + 1;
        if (*pbVar13 == 0x22) break;
      } while (*pbVar13 != 0);
    }
    else {
      while ((0x29 < (ulong)*pbVar13 || ((0x30100000201U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0))) {
        pbVar13 = pbVar13 + 1;
      }
    }
  }
  if (pbVar15 == (byte *)0x0) {
    local_50 = 1;
  }
  else {
    local_50 = strtol((char *)pbVar15,&local_60,10);
    if (*local_60 != '\0') {
      return 0;
    }
    if (local_50 - 0x7fffffffU < 0xffffffff00000002) {
      return 0;
    }
    pcVar16 = (char *)0x7;
  }
  local_40 = name_function(line);
  if (local_40 == (PF)0x0) {
    iVar4 = dobeep_msgs("Unknown function:",line);
    return iVar4;
  }
  if (local_40 == bindtokey || local_40 == unbindtokey) {
    pmVar6 = &fundamental_mode;
  }
  else {
    if (local_40 != localbind && local_40 != localunbind) {
      iVar4 = (local_40 == redefine_key) + 1;
      goto LAB_0010e661;
    }
    pmVar6 = curbp->b_modes[curbp->b_nmodes];
  }
  local_38 = pmVar6->p_map;
  iVar4 = 0;
LAB_0010e661:
  iVar5 = 0;
  tmp = pcVar16;
  plVar7 = lalloc(0);
  if (plVar7 != (line *)0x0) {
    maclcur = plVar7;
    plVar7->l_bp = plVar7;
    plVar7->l_fp = plVar7;
    if (*pbVar13 != 0) {
      plVar9 = (line *)0x0;
      local_48 = plVar7;
LAB_0010e69d:
      uVar8 = (ulong)pbVar13 & 0xffffffff;
      do {
        bVar1 = *pbVar13;
        if (bVar1 < 0x20) {
          if (bVar1 != 9) goto LAB_0010e6cb;
        }
        else if (bVar1 != 0x20) goto LAB_0010e6be;
        pbVar13 = pbVar13 + 1;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while( true );
    }
    plVar9 = (line *)0x0;
LAB_0010e99d:
    if (iVar4 == 1) {
      inmacro = 1;
      maclcur = maclcur->l_fp;
      iVar5 = (*local_40)((int)tmp,(int)local_50);
      inmacro = 0;
    }
    else if (iVar4 == 3) {
      bVar10 = local_40 == localunbind || local_40 == unbindtokey;
      iVar4 = (int)CONCAT71(0x10e2,bVar10);
      if (bVar10) {
        pcVar16 = (char *)0x0;
      }
      else {
        iVar4 = plVar9->l_used;
        plVar9->l_text[iVar4] = '\0';
        pcVar16 = plVar9->l_text;
      }
      iVar5 = bindkey(&local_38,pcVar16,(KCHAR *)(ulong)(uint)key.k_count,iVar4);
    }
    else {
      dobeep_msg("Bad args to set key");
      iVar5 = 0;
    }
LAB_0010ea7e:
    plVar7 = maclcur->l_fp;
    plVar9 = plVar7;
    if (plVar7 != maclcur) {
      do {
        plVar7 = plVar9->l_fp;
        free(plVar9);
        plVar9 = plVar7;
      } while (plVar7 != maclcur);
    }
    free(plVar7);
    maclhead = (line *)0x0;
    macrodef = 0;
  }
  return iVar5;
}

Assistant:

int
excline(char *line, int llen, int lnum)
{
	PF	 fp;
	struct line	*lp, *np;
	int	 status, c, f, n;
	char	*funcp, *tmp;
	char	*argp = NULL;
	long	 nl;
	int	 bind;
	KEYMAP	*curmap = NULL;
#define BINDARG		0  /* this arg is key to bind (local/global set key) */
#define	BINDNO		1  /* not binding or non-quoted BINDARG */
#define BINDNEXT	2  /* next arg " (define-key) */
#define BINDDO		3  /* already found key to bind */
#define BINDEXT		1  /* space for trailing \0 */

	lp = NULL;

	if (macrodef || inmacro)
		return (dobeep_msg("Not now!"));

	f = 0;
	n = 1;
	funcp = skipwhite(line);
	if (*funcp == '\0')
		return (TRUE);	/* No error on blank lines */
	if (*funcp == '(')
		return (foundparen(funcp, llen, lnum));
	line = parsetoken(funcp);
	if (*line != '\0') {
		*line++ = '\0';
		line = skipwhite(line);
		if (ISDIGIT(*line) || *line == '-') {
			argp = line;
			line = parsetoken(line);
		}
	}
	if (argp != NULL) {
		f = FFARG;
		nl = strtol(argp, &tmp, 10);
		if (*tmp != '\0')
			return (FALSE);
		if (nl >= INT_MAX || nl <= INT_MIN)
			return (FALSE);
		n = (int)nl;
	}
	if ((fp = name_function(funcp)) == NULL)
		return (dobeep_msgs("Unknown function:", funcp));

	if (fp == bindtokey || fp == unbindtokey) {
		bind = BINDARG;
		curmap = fundamental_map;
	} else if (fp == localbind || fp == localunbind) {
		bind = BINDARG;
		curmap = curbp->b_modes[curbp->b_nmodes]->p_map;
	} else if (fp == redefine_key)
		bind = BINDNEXT;
	else
		bind = BINDNO;
	/* Pack away all the args now... */
	if ((np = lalloc(0)) == FALSE)
		return (FALSE);
	np->l_fp = np->l_bp = maclcur = np;
	while (*line != '\0') {
		argp = skipwhite(line);
		if (*argp == '\0')
			break;
		line = parsetoken(argp);
		if (*argp != '"') {
			if (*argp == '\'')
				++argp;
			if ((lp = lalloc((int) (line - argp) + BINDEXT)) ==
			    NULL) {
				status = FALSE;
				goto cleanup;
			}
			bcopy(argp, ltext(lp), (int)(line - argp));
			/* don't count BINDEXT */
			lp->l_used--;
			if (bind == BINDARG)
				bind = BINDNO;
		} else {
			/* quoted strings are special */
			++argp;
			if (bind != BINDARG) {
				lp = lalloc((int)(line - argp) + BINDEXT);
				if (lp == NULL) {
					status = FALSE;
					goto cleanup;
				}
				lp->l_used = 0;
			} else
				key.k_count = 0;
			while (*argp != '"' && *argp != '\0') {
				if (*argp != '\\')
					c = *argp++;
				else {
					switch (*++argp) {
					case 't':
					case 'T':
						c = CCHR('I');
						break;
					case 'n':
					case 'N':
						c = CCHR('J');
						break;
					case 'r':
					case 'R':
						c = CCHR('M');
						break;
					case 'e':
					case 'E':
						c = CCHR('[');
						break;
					case '^':
						/*
						 * split into two statements
						 * due to bug in OSK cpp
						 */
						c = CHARMASK(*++argp);
						c = ISLOWER(c) ?
						    CCHR(TOUPPER(c)) : CCHR(c);
						break;
					case '0':
					case '1':
					case '2':
					case '3':
					case '4':
					case '5':
					case '6':
					case '7':
						c = *argp - '0';
						if (argp[1] <= '7' &&
						    argp[1] >= '0') {
							c <<= 3;
							c += *++argp - '0';
							if (argp[1] <= '7' &&
							    argp[1] >= '0') {
								c <<= 3;
								c += *++argp
								    - '0';
							}
						}
						break;
					case 'f':
					case 'F':
						c = *++argp - '0';
						if (ISDIGIT(argp[1])) {
							c *= 10;
							c += *++argp - '0';
						}
						c += KFIRST;
						break;
					default:
						c = CHARMASK(*argp);
						break;
					}
					argp++;
				}
				if (bind == BINDARG)
					key.k_chars[key.k_count++] = c;
				else
					lp->l_text[lp->l_used++] = c;
			}
			if (*line)
				line++;
		}
		switch (bind) {
		case BINDARG:
			bind = BINDDO;
			break;
		case BINDNEXT:
			lp->l_text[lp->l_used] = '\0';
			if ((curmap = name_map(lp->l_text)) == NULL) {
				(void)dobeep_msgs("No such mode:", lp->l_text);
				status = FALSE;
				free(lp);
				goto cleanup;
			}
			free(lp);
			bind = BINDARG;
			break;
		default:
			lp->l_fp = np->l_fp;
			lp->l_bp = np;
			np->l_fp = lp;
			np = lp;
		}
	}
	switch (bind) {
	default:
		(void)dobeep_msg("Bad args to set key");
		status = FALSE;
		break;
	case BINDDO:
		if (fp != unbindtokey && fp != localunbind) {
			lp->l_text[lp->l_used] = '\0';
			status = bindkey(&curmap, lp->l_text, key.k_chars,
			    key.k_count);
		} else
			status = bindkey(&curmap, NULL, key.k_chars,
			    key.k_count);
		break;
	case BINDNO:
		inmacro = TRUE;
		maclcur = maclcur->l_fp;
		status = (*fp)(f, n);
		inmacro = FALSE;
	}
cleanup:
	lp = maclcur->l_fp;
	while (lp != maclcur) {
		np = lp->l_fp;
		free(lp);
		lp = np;
	}
	free(lp);
	maclhead = NULL;
	macrodef = FALSE;
	return (status);
}